

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init_tests.cpp
# Opt level: O0

void wallet::init_tests::walletinit_verify_walletdir_no_trailing_invoker(void)

{
  basic_wrap_stringstream<char> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  long in_FS_OFFSET;
  walletinit_verify_walletdir_no_trailing t;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff168;
  std_string *in_stack_fffffffffffff170;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff178;
  const_string *in_stack_fffffffffffff190;
  size_t in_stack_fffffffffffff198;
  undefined1 *__s;
  const_string *in_stack_fffffffffffff1a0;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffff1a8;
  undefined1 local_cc0 [408];
  undefined1 local_b28 [408];
  undefined1 local_990 [408];
  undefined1 local_7f8 [1624];
  undefined1 local_1a0 [408];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff178,
             (pointer)in_stack_fffffffffffff170,(unsigned_long)in_stack_fffffffffffff168);
  memset(local_1a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff168);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff168);
  boost::operator<<(in_stack_fffffffffffff178,(char *)in_stack_fffffffffffff170);
  boost::operator<<(in_stack_fffffffffffff178,(char (*) [40])in_stack_fffffffffffff170);
  boost::operator<<(in_stack_fffffffffffff178,(char (*) [15])in_stack_fffffffffffff170);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff178);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff178,in_stack_fffffffffffff170);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff1a8,in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
             in_stack_fffffffffffff190);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff168);
  walletinit_verify_walletdir_no_trailing::walletinit_verify_walletdir_no_trailing
            ((walletinit_verify_walletdir_no_trailing *)in_stack_fffffffffffff168);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff178,
             (pointer)in_stack_fffffffffffff170,(unsigned_long)in_stack_fffffffffffff168);
  memset(local_7f8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff168);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff168);
  pbVar1 = boost::operator<<(in_stack_fffffffffffff178,(char *)in_stack_fffffffffffff170);
  boost::operator<<(in_stack_fffffffffffff178,(char (*) [40])in_stack_fffffffffffff170);
  boost::operator<<(in_stack_fffffffffffff178,(char (*) [16])in_stack_fffffffffffff170);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff178);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff178,in_stack_fffffffffffff170);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff1a8,in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
             in_stack_fffffffffffff190);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff168);
  boost::unit_test::setup_conditional<wallet::init_tests::walletinit_verify_walletdir_no_trailing>
            ((walletinit_verify_walletdir_no_trailing *)0xdb5b10);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff178,
             (pointer)in_stack_fffffffffffff170,(unsigned_long)in_stack_fffffffffffff168);
  memset(local_990,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff168);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff168);
  boost::operator<<(in_stack_fffffffffffff178,(char *)in_stack_fffffffffffff170);
  boost::operator<<(in_stack_fffffffffffff178,(char (*) [40])in_stack_fffffffffffff170);
  boost::operator<<(in_stack_fffffffffffff178,(char (*) [13])in_stack_fffffffffffff170);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff178);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff178,in_stack_fffffffffffff170);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff1a8,in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
             in_stack_fffffffffffff190);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff168);
  walletinit_verify_walletdir_no_trailing::test_method
            ((walletinit_verify_walletdir_no_trailing *)pbVar1);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff178,
             (pointer)in_stack_fffffffffffff170,(unsigned_long)in_stack_fffffffffffff168);
  memset(local_b28,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff168);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff168);
  boost::operator<<(in_stack_fffffffffffff178,(char *)in_stack_fffffffffffff170);
  boost::operator<<(in_stack_fffffffffffff178,(char (*) [40])in_stack_fffffffffffff170);
  boost::operator<<(in_stack_fffffffffffff178,(char (*) [19])in_stack_fffffffffffff170);
  this = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff178);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff178,in_stack_fffffffffffff170);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
             in_stack_fffffffffffff190);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff168);
  boost::unit_test::
  teardown_conditional<wallet::init_tests::walletinit_verify_walletdir_no_trailing>
            ((walletinit_verify_walletdir_no_trailing *)0xdb5d3c);
  file = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff178,
             (pointer)in_stack_fffffffffffff170,(unsigned_long)in_stack_fffffffffffff168);
  __s = local_cc0;
  memset(__s,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff168);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff168);
  pbVar1 = boost::operator<<(in_stack_fffffffffffff178,(char *)in_stack_fffffffffffff170);
  boost::operator<<(in_stack_fffffffffffff178,(char (*) [40])in_stack_fffffffffffff170);
  boost::operator<<(in_stack_fffffffffffff178,(char (*) [15])in_stack_fffffffffffff170);
  this_00 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff178);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)this_00,in_stack_fffffffffffff170);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,file,(size_t)__s,(const_string *)pbVar1);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff168);
  walletinit_verify_walletdir_no_trailing::~walletinit_verify_walletdir_no_trailing
            ((walletinit_verify_walletdir_no_trailing *)in_stack_fffffffffffff168);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(walletinit_verify_walletdir_no_trailing)
{
    SetWalletDir(m_walletdir_path_cases["trailing"]);
    bool result = m_wallet_loader->verify();
    BOOST_CHECK(result == true);
    fs::path walletdir = m_args.GetPathArg("-walletdir");
    fs::path expected_path = fs::canonical(m_walletdir_path_cases["default"]);
    BOOST_CHECK_EQUAL(walletdir, expected_path);
}